

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_NbAccV(int op,void *scale,armci_giov_t *darr,int len,int proc,armci_hdl_t *nb_handle)

{
  int iVar1;
  comex_giov_t *b;
  int in_ECX;
  armci_giov_t *in_RDX;
  undefined4 in_R8D;
  undefined8 in_R9;
  comex_giov_t *adarr;
  int rc;
  comex_giov_t *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd4;
  
  b = (comex_giov_t *)malloc((long)in_ECX * 0x18);
  convert_giov(in_RDX,b,in_ECX);
  iVar1 = comex_nbaccv(in_stack_ffffffffffffffd4,b,in_stack_ffffffffffffffc0,
                       (int)((ulong)in_R9 >> 0x20),(int)in_R9,0,
                       (comex_request_t *)CONCAT44(in_ECX,in_R8D));
  free(b);
  return iVar1;
}

Assistant:

int PARMCI_NbAccV(int op, void *scale, armci_giov_t *darr, int len, int proc, armci_hdl_t *nb_handle)
{
    int rc;
    comex_giov_t *adarr = malloc(sizeof(comex_giov_t) * len);
    convert_giov(darr, adarr, len);
    rc = comex_nbaccv(op, scale, adarr, len, proc, COMEX_GROUP_WORLD, nb_handle);
    free(adarr);
    return rc;
}